

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

void __thiscall
Time::LocalTime::getAsDate
          (LocalTime *this,int *year,int *month,int *dayOfMonth,int *hour,int *min,int *sec,
          int *dayOfWeek)

{
  undefined1 local_70 [8];
  tm ekT;
  int *min_local;
  int *hour_local;
  int *dayOfMonth_local;
  int *month_local;
  int *year_local;
  LocalTime *this_local;
  
  ekT.tm_zone = (char *)min;
  memset(local_70,0,0x38);
  makeLocalTime((this->super_Time).timeSinceEpoch.tv_sec,(tm *)local_70);
  *year = ekT.tm_mday;
  *month = ekT.tm_hour;
  *dayOfMonth = ekT.tm_min;
  *hour = ekT.tm_sec;
  *(undefined4 *)ekT.tm_zone = local_70._4_4_;
  *sec = local_70._0_4_;
  if (dayOfWeek != (int *)0x0) {
    *dayOfWeek = ekT.tm_mon;
  }
  return;
}

Assistant:

void LocalTime::getAsDate(int & year, int & month, int & dayOfMonth, int & hour, int & min, int & sec, int * dayOfWeek) const
    {
        struct tm ekT = {0};
        makeLocalTime(timeSinceEpoch.tv_sec, ekT);
        year = ekT.tm_year;
        month = ekT.tm_mon;
        dayOfMonth = ekT.tm_mday;
        hour = ekT.tm_hour;
        min = ekT.tm_min;
        sec = ekT.tm_sec;
        if (dayOfWeek) *dayOfWeek = ekT.tm_wday;
    }